

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  ushort uVar7;
  ushort uVar11;
  ushort uVar13;
  ushort uVar15;
  ushort uVar17;
  ushort uVar19;
  ushort uVar21;
  undefined1 auVar8 [16];
  ushort uVar23;
  undefined1 auVar9 [16];
  ushort uVar12;
  ushort uVar14;
  ushort uVar16;
  ushort uVar18;
  ushort uVar20;
  ushort uVar22;
  ushort uVar24;
  undefined1 auVar10 [16];
  short sVar25;
  short sVar29;
  short sVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ushort uVar33;
  short sVar34;
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar43;
  ushort uVar45;
  ushort uVar47;
  undefined1 auVar35 [16];
  short sVar38;
  short sVar40;
  short sVar42;
  short sVar44;
  short sVar46;
  short sVar48;
  ushort uVar49;
  short sVar50;
  undefined1 auVar36 [16];
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  __m128i local_248;
  __m128i local_238;
  __m128i local_228;
  __m128i d7;
  __m128i d6;
  __m128i d1;
  __m128i local_1e8;
  __m128i d0;
  __m128i local_1c8;
  __m128i d5;
  __m128i d4;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  __m128i q2;
  __m128i p1;
  __m128i x7;
  __m128i x6;
  __m128i t80;
  __m128i thresh0;
  __m128i p2;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i d3;
  __m128i d2;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  
  x0[0] = *(longlong *)(s + -3);
  x0[1] = *(longlong *)(s + 1);
  x1[0] = *(longlong *)(s + (long)p + -3);
  x1[1] = *(longlong *)(s + (long)p + -3 + 4);
  x2[0] = *(longlong *)(s + (long)(p * 2) + -3);
  x2[1] = *(longlong *)(s + (long)(p * 2) + -3 + 4);
  x3[0] = *(longlong *)(s + (long)(p * 3) + -3);
  x3[1] = *(longlong *)(s + (long)(p * 3) + -3 + 4);
  x4[0] = *(longlong *)(s + (long)(p * 4) + -3);
  x4[1] = *(longlong *)(s + (long)(p * 4) + -3 + 4);
  x5[0] = *(longlong *)(s + (long)(p * 5) + -3);
  x5[1] = *(longlong *)(s + (long)(p * 5) + -3 + 4);
  x6[0] = *(longlong *)(s + (long)(p * 6) + -3);
  x6[1] = *(longlong *)(s + (long)(p * 6) + -3 + 4);
  x7[0] = *(longlong *)(s + (long)(p * 7) + -3);
  x7[1] = *(longlong *)(s + (long)(p * 7) + -3 + 4);
  highbd_transpose8x8_sse2
            (&x0,&x1,&x2,&x3,&x4,&x5,&x6,&x7,&p2,&p1,&local_228,&local_238,&local_248,&q2,&d6,&d7);
  get_limit_dual(_blimit0,_limit0,_thresh0,_blimit1,_limit1,_thresh1,bd,&d4,&d5,&thresh0,&t80);
  auVar3 = psubusw((undefined1  [16])p2,(undefined1  [16])p1);
  auVar35 = psubusw((undefined1  [16])p1,(undefined1  [16])p2);
  auVar35 = auVar35 | auVar3;
  auVar3 = psubusw((undefined1  [16])p1,(undefined1  [16])local_228);
  auVar4 = psubusw((undefined1  [16])local_228,(undefined1  [16])p1);
  auVar4 = auVar4 | auVar3;
  auVar3 = psubusw((undefined1  [16])local_248,(undefined1  [16])local_238);
  auVar8 = psubusw((undefined1  [16])local_238,(undefined1  [16])local_248);
  auVar8 = auVar8 | auVar3;
  sVar25 = auVar4._0_2_;
  sVar29 = auVar8._0_2_;
  uVar6 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._2_2_;
  sVar29 = auVar8._2_2_;
  uVar11 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._4_2_;
  sVar29 = auVar8._4_2_;
  uVar13 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._6_2_;
  sVar29 = auVar8._6_2_;
  uVar15 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._8_2_;
  sVar29 = auVar8._8_2_;
  uVar17 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._10_2_;
  sVar29 = auVar8._10_2_;
  uVar19 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._12_2_;
  sVar29 = auVar8._12_2_;
  sVar30 = auVar8._14_2_;
  uVar21 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._14_2_;
  uVar23 = (ushort)(sVar30 < sVar25) * sVar25 | (ushort)(sVar30 >= sVar25) * sVar30;
  auVar4 = psubusw((undefined1  [16])q2,(undefined1  [16])local_248);
  auVar3 = psubusw((undefined1  [16])local_248,(undefined1  [16])q2);
  auVar3 = auVar3 | auVar4;
  auVar4 = psubusw((undefined1  [16])local_228,(undefined1  [16])local_238);
  auVar9 = psubusw((undefined1  [16])local_238,(undefined1  [16])local_228);
  auVar8 = psubusw((undefined1  [16])p1,(undefined1  [16])local_248);
  auVar26 = psubusw((undefined1  [16])local_248,(undefined1  [16])p1);
  auVar26 = auVar26 | auVar8;
  auVar4 = paddusw(auVar9 | auVar4,auVar9 | auVar4);
  auVar27._0_2_ = auVar26._0_2_ >> 1;
  auVar27._2_2_ = auVar26._2_2_ >> 1;
  auVar27._4_2_ = auVar26._4_2_ >> 1;
  auVar27._6_2_ = auVar26._6_2_ >> 1;
  auVar27._8_2_ = auVar26._8_2_ >> 1;
  auVar27._10_2_ = auVar26._10_2_ >> 1;
  auVar27._12_2_ = auVar26._12_2_ >> 1;
  auVar27._14_2_ = auVar26._14_2_ >> 1;
  auVar4 = paddusw(auVar27,auVar4);
  auVar4 = auVar4 ^ _DAT_0043cc80;
  auVar8._8_8_ = d4[1];
  auVar8._0_8_ = d4[0];
  auVar8 = _DAT_0043cc80 ^ auVar8;
  auVar28._0_2_ = -(ushort)(auVar8._0_2_ < auVar4._0_2_);
  auVar28._2_2_ = -(ushort)(auVar8._2_2_ < auVar4._2_2_);
  auVar28._4_2_ = -(ushort)(auVar8._4_2_ < auVar4._4_2_);
  auVar28._6_2_ = -(ushort)(auVar8._6_2_ < auVar4._6_2_);
  auVar28._8_2_ = -(ushort)(auVar8._8_2_ < auVar4._8_2_);
  auVar28._10_2_ = -(ushort)(auVar8._10_2_ < auVar4._10_2_);
  auVar28._12_2_ = -(ushort)(auVar8._12_2_ < auVar4._12_2_);
  auVar28._14_2_ = -(ushort)(auVar8._14_2_ < auVar4._14_2_);
  auVar4._8_8_ = d5[1];
  auVar4._0_8_ = d5[0];
  auVar8 = paddusw(auVar4,_DAT_00476bb0);
  auVar8 = auVar8 & auVar28;
  sVar25 = auVar3._0_2_;
  sVar29 = auVar8._0_2_;
  uVar7 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._2_2_;
  sVar29 = auVar8._2_2_;
  uVar12 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._4_2_;
  sVar29 = auVar8._4_2_;
  uVar14 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._6_2_;
  sVar29 = auVar8._6_2_;
  uVar16 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._8_2_;
  sVar29 = auVar8._8_2_;
  uVar18 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._10_2_;
  sVar29 = auVar8._10_2_;
  uVar20 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._12_2_;
  sVar29 = auVar8._12_2_;
  sVar30 = auVar8._14_2_;
  uVar22 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar3._14_2_;
  uVar24 = (ushort)(sVar30 < sVar25) * sVar25 | (ushort)(sVar30 >= sVar25) * sVar30;
  sVar25 = auVar35._0_2_;
  uVar33 = (sVar25 < (short)uVar6) * uVar6 | (ushort)(sVar25 >= (short)uVar6) * sVar25;
  sVar25 = auVar35._2_2_;
  uVar37 = (sVar25 < (short)uVar11) * uVar11 | (ushort)(sVar25 >= (short)uVar11) * sVar25;
  sVar25 = auVar35._4_2_;
  uVar39 = (sVar25 < (short)uVar13) * uVar13 | (ushort)(sVar25 >= (short)uVar13) * sVar25;
  sVar25 = auVar35._6_2_;
  uVar41 = (sVar25 < (short)uVar15) * uVar15 | (ushort)(sVar25 >= (short)uVar15) * sVar25;
  sVar25 = auVar35._8_2_;
  uVar43 = (sVar25 < (short)uVar17) * uVar17 | (ushort)(sVar25 >= (short)uVar17) * sVar25;
  sVar25 = auVar35._10_2_;
  uVar45 = (sVar25 < (short)uVar19) * uVar19 | (ushort)(sVar25 >= (short)uVar19) * sVar25;
  sVar25 = auVar35._12_2_;
  sVar29 = auVar35._14_2_;
  uVar47 = (sVar25 < (short)uVar21) * uVar21 | (ushort)(sVar25 >= (short)uVar21) * sVar25;
  uVar49 = (sVar29 < (short)uVar23) * uVar23 | (ushort)(sVar29 >= (short)uVar23) * sVar29;
  auVar35._0_2_ = ((short)uVar33 < (short)uVar7) * uVar7 | ((short)uVar33 >= (short)uVar7) * uVar33;
  auVar35._2_2_ =
       ((short)uVar37 < (short)uVar12) * uVar12 | ((short)uVar37 >= (short)uVar12) * uVar37;
  auVar35._4_2_ =
       ((short)uVar39 < (short)uVar14) * uVar14 | ((short)uVar39 >= (short)uVar14) * uVar39;
  auVar35._6_2_ =
       ((short)uVar41 < (short)uVar16) * uVar16 | ((short)uVar41 >= (short)uVar16) * uVar41;
  auVar35._8_2_ =
       ((short)uVar43 < (short)uVar18) * uVar18 | ((short)uVar43 >= (short)uVar18) * uVar43;
  auVar35._10_2_ =
       ((short)uVar45 < (short)uVar20) * uVar20 | ((short)uVar45 >= (short)uVar20) * uVar45;
  auVar35._12_2_ =
       ((short)uVar47 < (short)uVar22) * uVar22 | ((short)uVar47 >= (short)uVar22) * uVar47;
  auVar35._14_2_ =
       ((short)uVar49 < (short)uVar24) * uVar24 | ((short)uVar49 >= (short)uVar24) * uVar49;
  auVar3 = psubusw(auVar35,auVar4);
  sVar34 = -(ushort)(auVar3._0_2_ == 0);
  sVar38 = -(ushort)(auVar3._2_2_ == 0);
  sVar40 = -(ushort)(auVar3._4_2_ == 0);
  sVar42 = -(ushort)(auVar3._6_2_ == 0);
  sVar44 = -(ushort)(auVar3._8_2_ == 0);
  sVar46 = -(ushort)(auVar3._10_2_ == 0);
  sVar48 = -(ushort)(auVar3._12_2_ == 0);
  sVar50 = -(ushort)(auVar3._14_2_ == 0);
  d2[0] = local_228[0];
  d2[1] = local_228[1];
  d3[0] = local_238[0];
  d3[1] = local_238[1];
  local_48 = sVar34;
  sStack_46 = sVar38;
  sStack_44 = sVar40;
  sStack_42 = sVar42;
  sStack_40 = sVar44;
  sStack_3e = sVar46;
  sStack_3c = sVar48;
  sStack_3a = sVar50;
  highbd_filter4_dual_sse2(&d2,&d3,&d0,&d1,(__m128i *)&local_48,&thresh0,bd,&t80);
  auVar3 = psubusw((undefined1  [16])q2,(undefined1  [16])local_238);
  auVar4 = psubusw((undefined1  [16])local_238,(undefined1  [16])q2);
  auVar4 = auVar4 | auVar3;
  auVar8 = psubusw((undefined1  [16])p2,(undefined1  [16])local_228);
  auVar3 = psubusw((undefined1  [16])local_228,(undefined1  [16])p2);
  auVar3 = auVar3 | auVar8;
  sVar25 = auVar4._0_2_;
  sVar29 = auVar3._0_2_;
  uVar7 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._2_2_;
  sVar29 = auVar3._2_2_;
  uVar12 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._4_2_;
  sVar29 = auVar3._4_2_;
  uVar14 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._6_2_;
  sVar29 = auVar3._6_2_;
  uVar16 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._8_2_;
  sVar29 = auVar3._8_2_;
  uVar18 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._10_2_;
  sVar29 = auVar3._10_2_;
  uVar20 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._12_2_;
  sVar29 = auVar3._12_2_;
  sVar30 = auVar3._14_2_;
  uVar22 = (ushort)(sVar29 < sVar25) * sVar25 | (ushort)(sVar29 >= sVar25) * sVar29;
  sVar25 = auVar4._14_2_;
  uVar24 = (ushort)(sVar30 < sVar25) * sVar25 | (ushort)(sVar30 >= sVar25) * sVar30;
  auVar9._0_2_ = ((short)uVar7 < (short)uVar6) * uVar6 | ((short)uVar7 >= (short)uVar6) * uVar7;
  auVar9._2_2_ = ((short)uVar12 < (short)uVar11) * uVar11 |
                 ((short)uVar12 >= (short)uVar11) * uVar12;
  auVar9._4_2_ = ((short)uVar14 < (short)uVar13) * uVar13 |
                 ((short)uVar14 >= (short)uVar13) * uVar14;
  auVar9._6_2_ = ((short)uVar16 < (short)uVar15) * uVar15 |
                 ((short)uVar16 >= (short)uVar15) * uVar16;
  auVar9._8_2_ = ((short)uVar18 < (short)uVar17) * uVar17 |
                 ((short)uVar18 >= (short)uVar17) * uVar18;
  auVar9._10_2_ =
       ((short)uVar20 < (short)uVar19) * uVar19 | ((short)uVar20 >= (short)uVar19) * uVar20;
  auVar9._12_2_ =
       ((short)uVar22 < (short)uVar21) * uVar21 | ((short)uVar22 >= (short)uVar21) * uVar22;
  auVar9._14_2_ =
       ((short)uVar24 < (short)uVar23) * uVar23 | ((short)uVar24 >= (short)uVar23) * uVar24;
  auVar3 = psllw(_DAT_00476bb0,ZEXT416(bd - 8));
  auVar3 = psubusw(auVar9,auVar3);
  auVar26._0_2_ = -(ushort)(auVar3._0_2_ == 0);
  auVar26._2_2_ = -(ushort)(auVar3._2_2_ == 0);
  auVar26._4_2_ = -(ushort)(auVar3._4_2_ == 0);
  auVar26._6_2_ = -(ushort)(auVar3._6_2_ == 0);
  auVar26._8_2_ = -(ushort)(auVar3._8_2_ == 0);
  auVar26._10_2_ = -(ushort)(auVar3._10_2_ == 0);
  auVar26._12_2_ = -(ushort)(auVar3._12_2_ == 0);
  auVar26._14_2_ = -(ushort)(auVar3._14_2_ == 0);
  auVar3._2_2_ = sVar38;
  auVar3._0_2_ = sVar34;
  auVar3._4_2_ = sVar40;
  auVar3._6_2_ = sVar42;
  auVar3._8_2_ = sVar44;
  auVar3._10_2_ = sVar46;
  auVar3._12_2_ = sVar48;
  auVar3._14_2_ = sVar50;
  auVar26 = auVar26 & auVar3;
  if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar26 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar26 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar26 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar26 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar26 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar26 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar26 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar26 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar26 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar26[0xf]) {
    local_238[1] = d1[1];
    local_238[0] = d1[0];
    local_228[1] = d0[1];
    local_228[0] = d0[0];
  }
  else {
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar10 = auVar10 ^ auVar26;
    local_198 = (short)p1[0];
    sStack_196 = p1[0]._2_2_;
    sStack_194 = p1[0]._4_2_;
    sStack_192 = p1[0]._6_2_;
    sStack_190 = (short)p1[1];
    sStack_18e = p1[1]._2_2_;
    sStack_18c = p1[1]._4_2_;
    sStack_18a = p1[1]._6_2_;
    sVar46 = (short)local_228[0] + local_198;
    sVar48 = local_228[0]._2_2_ + sStack_196;
    sVar50 = local_228[0]._4_2_ + sStack_194;
    sVar51 = local_228[0]._6_2_ + sStack_192;
    sVar52 = (short)local_228[1] + sStack_190;
    sVar53 = local_228[1]._2_2_ + sStack_18e;
    sVar54 = local_228[1]._4_2_ + sStack_18c;
    sVar55 = local_228[1]._6_2_ + sStack_18a;
    sVar56 = (short)p2[0];
    sVar57 = p2[0]._2_2_;
    sVar58 = p2[0]._4_2_;
    sVar59 = p2[0]._6_2_;
    sVar60 = (short)p2[1];
    sVar61 = p2[1]._2_2_;
    sVar62 = p2[1]._4_2_;
    sVar63 = p2[1]._6_2_;
    sVar25 = sVar46 * 2 + sVar56 + 4;
    sVar29 = sVar48 * 2 + sVar57 + 4;
    sVar30 = sVar50 * 2 + sVar58 + 4;
    sVar34 = sVar51 * 2 + sVar59 + 4;
    sVar38 = sVar52 * 2 + sVar60 + 4;
    sVar40 = sVar53 * 2 + sVar61 + 4;
    sVar42 = sVar54 * 2 + sVar62 + 4;
    sVar44 = sVar55 * 2 + sVar63 + 4;
    auVar5._0_2_ = (ushort)(sVar56 * 2 + (short)local_238[0] + sVar25) >> 3;
    auVar5._2_2_ = (ushort)(sVar57 * 2 + local_238[0]._2_2_ + sVar29) >> 3;
    auVar5._4_2_ = (ushort)(sVar58 * 2 + local_238[0]._4_2_ + sVar30) >> 3;
    auVar5._6_2_ = (ushort)(sVar59 * 2 + local_238[0]._6_2_ + sVar34) >> 3;
    auVar5._8_2_ = (ushort)(sVar60 * 2 + (short)local_238[1] + sVar38) >> 3;
    auVar5._10_2_ = (ushort)(sVar61 * 2 + local_238[1]._2_2_ + sVar40) >> 3;
    auVar5._12_2_ = (ushort)(sVar62 * 2 + local_238[1]._4_2_ + sVar42) >> 3;
    auVar5._14_2_ = (ushort)(sVar63 * 2 + local_238[1]._6_2_ + sVar44) >> 3;
    local_188 = (short)local_248[0];
    sStack_186 = local_248[0]._2_2_;
    sStack_184 = local_248[0]._4_2_;
    sStack_182 = local_248[0]._6_2_;
    sStack_180 = (short)local_248[1];
    sStack_17e = local_248[1]._2_2_;
    sStack_17c = local_248[1]._4_2_;
    sStack_17a = local_248[1]._6_2_;
    uVar7 = (short)local_238[0] * 2 + local_188 + sVar25;
    uVar12 = local_238[0]._2_2_ * 2 + sStack_186 + sVar29;
    uVar14 = local_238[0]._4_2_ * 2 + sStack_184 + sVar30;
    uVar16 = local_238[0]._6_2_ * 2 + sStack_182 + sVar34;
    uVar18 = (short)local_238[1] * 2 + sStack_180 + sVar38;
    uVar20 = local_238[1]._2_2_ * 2 + sStack_17e + sVar40;
    uVar22 = local_238[1]._4_2_ * 2 + sStack_17c + sVar42;
    uVar24 = local_238[1]._6_2_ * 2 + sStack_17a + sVar44;
    uVar6 = (local_188 - (sVar56 + local_198)) + (short)q2[0] + uVar7;
    uVar11 = (sStack_186 - (sVar57 + sStack_196)) + q2[0]._2_2_ + uVar12;
    uVar13 = (sStack_184 - (sVar58 + sStack_194)) + q2[0]._4_2_ + uVar14;
    uVar15 = (sStack_182 - (sVar59 + sStack_192)) + q2[0]._6_2_ + uVar16;
    uVar17 = (sStack_180 - (sVar60 + sStack_190)) + (short)q2[1] + uVar18;
    uVar19 = (sStack_17e - (sVar61 + sStack_18e)) + q2[1]._2_2_ + uVar20;
    uVar21 = (sStack_17c - (sVar62 + sStack_18c)) + q2[1]._4_2_ + uVar22;
    uVar23 = (sStack_17a - (sVar63 + sStack_18a)) + q2[1]._6_2_ + uVar24;
    auVar31._0_2_ = uVar7 >> 3;
    auVar31._2_2_ = uVar12 >> 3;
    auVar31._4_2_ = uVar14 >> 3;
    auVar31._6_2_ = uVar16 >> 3;
    auVar31._8_2_ = uVar18 >> 3;
    auVar31._10_2_ = uVar20 >> 3;
    auVar31._12_2_ = uVar22 >> 3;
    auVar31._14_2_ = uVar24 >> 3;
    auVar32._0_2_ = uVar6 >> 3;
    auVar32._2_2_ = uVar11 >> 3;
    auVar32._4_2_ = uVar13 >> 3;
    auVar32._6_2_ = uVar15 >> 3;
    auVar32._8_2_ = uVar17 >> 3;
    auVar32._10_2_ = uVar19 >> 3;
    auVar32._12_2_ = uVar21 >> 3;
    auVar32._14_2_ = uVar23 >> 3;
    auVar36._0_2_ = (ushort)(((short)q2[0] * 2 - sVar46) + uVar6) >> 3;
    auVar36._2_2_ = (ushort)((q2[0]._2_2_ * 2 - sVar48) + uVar11) >> 3;
    auVar36._4_2_ = (ushort)((q2[0]._4_2_ * 2 - sVar50) + uVar13) >> 3;
    auVar36._6_2_ = (ushort)((q2[0]._6_2_ * 2 - sVar51) + uVar15) >> 3;
    auVar36._8_2_ = (ushort)(((short)q2[1] * 2 - sVar52) + uVar17) >> 3;
    auVar36._10_2_ = (ushort)((q2[1]._2_2_ * 2 - sVar53) + uVar19) >> 3;
    auVar36._12_2_ = (ushort)((q2[1]._4_2_ * 2 - sVar54) + uVar21) >> 3;
    auVar36._14_2_ = (ushort)((q2[1]._6_2_ * 2 - sVar55) + uVar23) >> 3;
    auVar1._8_8_ = d1[1];
    auVar1._0_8_ = d1[0];
    local_238 = (__m128i)(auVar32 & auVar26 | auVar1 & auVar10);
    local_1e8 = (__m128i)(auVar36 & auVar26 | (undefined1  [16])local_1e8 & auVar10);
    auVar2._8_8_ = d0[1];
    auVar2._0_8_ = d0[0];
    local_228 = (__m128i)(auVar31 & auVar26 | auVar2 & auVar10);
    local_1c8 = (__m128i)(auVar5 & auVar26 | auVar10 & (undefined1  [16])local_1c8);
  }
  local_248 = local_1e8;
  p1 = local_1c8;
  highbd_transpose4x8_8x4_sse2(&p1,&local_228,&local_238,&local_248,&d0,&d1,&d2,&d3,&d4,&d5,&d6,&d7)
  ;
  *(longlong *)(s + -2) = d0[0];
  *(longlong *)(s + (long)p + -2) = d1[0];
  *(longlong *)(s + (long)(p * 2) + -2) = d2[0];
  *(longlong *)(s + (long)(p * 3) + -2) = d3[0];
  *(longlong *)(s + (long)(p * 4) + -2) = d4[0];
  *(longlong *)(s + (long)(p * 5) + -2) = d5[0];
  *(longlong *)(s + (long)(p * 6) + -2) = d6[0];
  *(longlong *)(s + (long)(p * 7) + -2) = d7[0];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i p0, q0, p1, q1, p2, q2;

  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 3) + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 3) + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)((s - 3) + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)((s - 3) + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &p2, &p1,
                           &p0, &q0, &q1, &q2, &d6, &d7);

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&p1, &p0, &q0, &q1, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}